

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O3

void lowbd_fwd_txfm2d_32x64_avx2(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  int32_t *piVar1;
  byte bVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int8_t *piVar6;
  bool bVar7;
  uint uVar8;
  int16_t *piVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  bool bVar13;
  __m256i *out;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  __m256i bufB [32];
  __m256i bufA [32];
  __m256i buf0 [64];
  __m256i buf1 [256];
  longlong local_3060 [128];
  longlong local_2c60 [128];
  longlong local_2860 [256];
  longlong local_2060 [2];
  undefined1 local_2050 [496];
  longlong alStack_1e60 [966];
  
  piVar6 = av1_fwd_txfm_shift_ls[0xb];
  lVar10 = 0;
  out = (__m256i *)local_2060;
  bVar7 = true;
  do {
    bVar13 = bVar7;
    piVar9 = input + lVar10;
    lVar10 = 0;
    do {
      uVar3 = *(undefined8 *)(piVar9 + 4);
      uVar4 = *(undefined8 *)(piVar9 + 8);
      uVar5 = *(undefined8 *)(piVar9 + 0xc);
      *(undefined8 *)((long)local_2860 + lVar10) = *(undefined8 *)piVar9;
      *(undefined8 *)((long)local_2860 + lVar10 + 8) = uVar3;
      *(undefined8 *)((long)local_2860 + lVar10 + 0x10) = uVar4;
      *(undefined8 *)((long)local_2860 + lVar10 + 0x18) = uVar5;
      lVar10 = lVar10 + 0x20;
      piVar9 = piVar9 + stride;
    } while (lVar10 != 0x800);
    bVar2 = *piVar6;
    if ((char)bVar2 < '\0') {
      auVar16._0_2_ = (undefined2)(1 << (~bVar2 & 0x1f));
      auVar16._2_2_ = auVar16._0_2_;
      auVar16._4_2_ = auVar16._0_2_;
      auVar16._6_2_ = auVar16._0_2_;
      auVar16._8_2_ = auVar16._0_2_;
      auVar16._10_2_ = auVar16._0_2_;
      auVar16._12_2_ = auVar16._0_2_;
      auVar16._14_2_ = auVar16._0_2_;
      auVar16._16_2_ = auVar16._0_2_;
      auVar16._18_2_ = auVar16._0_2_;
      auVar16._20_2_ = auVar16._0_2_;
      auVar16._22_2_ = auVar16._0_2_;
      auVar16._24_2_ = auVar16._0_2_;
      auVar16._26_2_ = auVar16._0_2_;
      auVar16._28_2_ = auVar16._0_2_;
      auVar16._30_2_ = auVar16._0_2_;
      lVar10 = 0;
      do {
        auVar14 = vpaddsw_avx2(auVar16,*(undefined1 (*) [32])((long)local_2860 + lVar10));
        auVar14 = vpsraw_avx2(auVar14,ZEXT416((uint)-(int)(char)bVar2));
        *(undefined1 (*) [32])((long)local_2860 + lVar10) = auVar14;
        lVar10 = lVar10 + 0x20;
      } while (lVar10 != 0x800);
    }
    else if (bVar2 != 0) {
      lVar10 = 0;
      do {
        auVar16 = vpsllw_avx2(*(undefined1 (*) [32])((long)local_2860 + lVar10),
                              ZEXT416((uint)(int)(char)bVar2));
        *(undefined1 (*) [32])((long)local_2860 + lVar10) = auVar16;
        lVar10 = lVar10 + 0x20;
      } while (lVar10 != 0x800);
    }
    fdct16x64_new_avx2((__m256i *)local_2860,(__m256i *)local_2860,'\r');
    bVar2 = piVar6[1];
    if ((char)bVar2 < '\0') {
      auVar14._0_2_ = (undefined2)(1 << (~bVar2 & 0x1f));
      auVar14._2_2_ = auVar14._0_2_;
      auVar14._4_2_ = auVar14._0_2_;
      auVar14._6_2_ = auVar14._0_2_;
      auVar14._8_2_ = auVar14._0_2_;
      auVar14._10_2_ = auVar14._0_2_;
      auVar14._12_2_ = auVar14._0_2_;
      auVar14._14_2_ = auVar14._0_2_;
      auVar14._16_2_ = auVar14._0_2_;
      auVar14._18_2_ = auVar14._0_2_;
      auVar14._20_2_ = auVar14._0_2_;
      auVar14._22_2_ = auVar14._0_2_;
      auVar14._24_2_ = auVar14._0_2_;
      auVar14._26_2_ = auVar14._0_2_;
      auVar14._28_2_ = auVar14._0_2_;
      auVar14._30_2_ = auVar14._0_2_;
      lVar10 = 0;
      do {
        auVar16 = vpaddsw_avx2(auVar14,*(undefined1 (*) [32])((long)local_2860 + lVar10));
        auVar16 = vpsraw_avx2(auVar16,ZEXT416((uint)-(int)(char)bVar2));
        *(undefined1 (*) [32])((long)local_2860 + lVar10) = auVar16;
        lVar10 = lVar10 + 0x20;
      } while (lVar10 != 0x800);
    }
    else if (bVar2 != 0) {
      lVar10 = 0;
      do {
        auVar16 = vpsllw_avx2(*(undefined1 (*) [32])((long)local_2860 + lVar10),
                              ZEXT416((uint)(int)(char)bVar2));
        *(undefined1 (*) [32])((long)local_2860 + lVar10) = auVar16;
        lVar10 = lVar10 + 0x20;
      } while (lVar10 != 0x800);
    }
    transpose_16bit_16x16_avx2((__m256i *)local_2860,out);
    transpose_16bit_16x16_avx2((__m256i *)(local_2860 + 0x40),out + 0x20);
    lVar10 = 0x10;
    out = (__m256i *)alStack_1e60;
    bVar7 = false;
  } while (bVar13);
  lVar10 = 0;
  bVar7 = true;
  do {
    bVar13 = bVar7;
    lVar11 = 0;
    do {
      auVar16 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)local_2060 + lVar11 + lVar10 * 0x400));
      auVar14 = vpmovsxwd_avx2(*(undefined1 (*) [16])(local_2050 + lVar11 + lVar10 * 0x400));
      *(undefined1 (*) [32])((long)local_2c60 + lVar11) = auVar16;
      *(undefined1 (*) [32])((long)local_3060 + lVar11) = auVar14;
      lVar11 = lVar11 + 0x20;
    } while (lVar11 != 0x400);
    fdct32_avx2((__m256i *)local_2c60,(__m256i *)local_2c60,'\v');
    fdct32_avx2((__m256i *)local_3060,(__m256i *)local_3060,'\v');
    bVar2 = piVar6[2];
    uVar8 = (uint)(char)bVar2;
    if ((int)uVar8 < 0) {
      iVar12 = 1 << (~bVar2 & 0x1f);
      auVar17._4_4_ = iVar12;
      auVar17._0_4_ = iVar12;
      auVar17._8_4_ = iVar12;
      auVar17._12_4_ = iVar12;
      auVar17._16_4_ = iVar12;
      auVar17._20_4_ = iVar12;
      auVar17._24_4_ = iVar12;
      auVar17._28_4_ = iVar12;
      lVar11 = 0;
      auVar18._8_4_ = 0x16a1;
      auVar18._0_8_ = 0x16a1000016a1;
      auVar18._12_4_ = 0x16a1;
      auVar18._16_4_ = 0x16a1;
      auVar18._20_4_ = 0x16a1;
      auVar18._24_4_ = 0x16a1;
      auVar18._28_4_ = 0x16a1;
      auVar19._8_4_ = 0x800;
      auVar19._0_8_ = 0x80000000800;
      auVar19._12_4_ = 0x800;
      auVar19._16_4_ = 0x800;
      auVar19._20_4_ = 0x800;
      auVar19._24_4_ = 0x800;
      auVar19._28_4_ = 0x800;
      do {
        auVar16 = vpaddd_avx2(auVar17,*(undefined1 (*) [32])((long)local_2c60 + lVar11));
        auVar16 = vpsrad_avx2(auVar16,ZEXT416(-uVar8));
        auVar16 = vpmulld_avx2(auVar16,auVar18);
        auVar16 = vpaddd_avx2(auVar16,auVar19);
        auVar16 = vpsrad_avx2(auVar16,0xc);
        *(undefined1 (*) [32])((long)local_2c60 + lVar11) = auVar16;
        lVar11 = lVar11 + 0x20;
      } while (lVar11 != 0x400);
    }
    else {
      lVar11 = 0;
      auVar18._8_4_ = 0x16a1;
      auVar18._0_8_ = 0x16a1000016a1;
      auVar18._12_4_ = 0x16a1;
      auVar18._16_4_ = 0x16a1;
      auVar18._20_4_ = 0x16a1;
      auVar18._24_4_ = 0x16a1;
      auVar18._28_4_ = 0x16a1;
      auVar19._8_4_ = 0x800;
      auVar19._0_8_ = 0x80000000800;
      auVar19._12_4_ = 0x800;
      auVar19._16_4_ = 0x800;
      auVar19._20_4_ = 0x800;
      auVar19._24_4_ = 0x800;
      auVar19._28_4_ = 0x800;
      do {
        auVar16 = vpslld_avx2(*(undefined1 (*) [32])((long)local_2c60 + lVar11),ZEXT416(uVar8));
        auVar16 = vpmulld_avx2(auVar16,auVar18);
        auVar16 = vpaddd_avx2(auVar16,auVar19);
        auVar16 = vpsrad_avx2(auVar16,0xc);
        *(undefined1 (*) [32])((long)local_2c60 + lVar11) = auVar16;
        lVar11 = lVar11 + 0x20;
      } while (lVar11 != 0x400);
    }
    if ((char)bVar2 < '\0') {
      iVar12 = 1 << (~bVar2 & 0x1f);
      auVar15._4_4_ = iVar12;
      auVar15._0_4_ = iVar12;
      auVar15._8_4_ = iVar12;
      auVar15._12_4_ = iVar12;
      auVar15._16_4_ = iVar12;
      auVar15._20_4_ = iVar12;
      auVar15._24_4_ = iVar12;
      auVar15._28_4_ = iVar12;
      lVar11 = 0;
      do {
        auVar16 = vpaddd_avx2(auVar15,*(undefined1 (*) [32])((long)local_3060 + lVar11));
        auVar16 = vpsrad_avx2(auVar16,ZEXT416(-uVar8));
        auVar16 = vpmulld_avx2(auVar16,auVar18);
        auVar16 = vpaddd_avx2(auVar16,auVar19);
        auVar16 = vpsrad_avx2(auVar16,0xc);
        *(undefined1 (*) [32])((long)local_3060 + lVar11) = auVar16;
        lVar11 = lVar11 + 0x20;
      } while (lVar11 != 0x400);
    }
    else {
      lVar11 = 0;
      do {
        auVar16 = vpslld_avx2(*(undefined1 (*) [32])((long)local_3060 + lVar11),ZEXT416(uVar8));
        auVar16 = vpmulld_avx2(auVar16,auVar18);
        auVar16 = vpaddd_avx2(auVar16,auVar19);
        auVar16 = vpsrad_avx2(auVar16,0xc);
        *(undefined1 (*) [32])((long)local_3060 + lVar11) = auVar16;
        lVar11 = lVar11 + 0x20;
      } while (lVar11 != 0x400);
    }
    lVar11 = 0;
    do {
      uVar3 = *(undefined8 *)((long)local_2c60 + lVar11 + 8);
      uVar4 = *(undefined8 *)((long)local_2c60 + lVar11 + 0x10);
      uVar5 = *(undefined8 *)((long)local_2c60 + lVar11 + 0x18);
      piVar1 = output + lVar10 * 0x10 + lVar11;
      *(undefined8 *)piVar1 = *(undefined8 *)((long)local_2c60 + lVar11);
      *(undefined8 *)(piVar1 + 2) = uVar3;
      *(undefined8 *)(piVar1 + 4) = uVar4;
      *(undefined8 *)(piVar1 + 6) = uVar5;
      uVar3 = *(undefined8 *)((long)local_3060 + lVar11 + 8);
      uVar4 = *(undefined8 *)((long)local_3060 + lVar11 + 0x10);
      uVar5 = *(undefined8 *)((long)local_3060 + lVar11 + 0x18);
      piVar1 = output + lVar10 * 0x10 + lVar11 + 8;
      *(undefined8 *)piVar1 = *(undefined8 *)((long)local_3060 + lVar11);
      *(undefined8 *)(piVar1 + 2) = uVar3;
      *(undefined8 *)(piVar1 + 4) = uVar4;
      *(undefined8 *)(piVar1 + 6) = uVar5;
      lVar11 = lVar11 + 0x20;
    } while (lVar11 != 0x400);
    lVar10 = 1;
    bVar7 = false;
  } while (bVar13);
  return;
}

Assistant:

static void lowbd_fwd_txfm2d_32x64_avx2(const int16_t *input, int32_t *output,
                                        int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  (void)tx_type;
  assert(tx_type == DCT_DCT);
  const TX_SIZE tx_size = TX_32X64;
  __m256i buf0[64], buf1[256];
  const int8_t *shift = av1_fwd_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = tx_size_wide[tx_size];
  const int height = tx_size_high[tx_size];
  const transform_1d_avx2 col_txfm = fdct16x64_new_avx2;
  const int width_div16 = (width >> 4);
  const int height_div16 = (height >> 4);

  for (int i = 0; i < width_div16; i++) {
    load_buffer_16bit_to_16bit_avx2(input + 16 * i, stride, buf0, height);
    round_shift_16bit_w16_avx2(buf0, height, shift[0]);
    col_txfm(buf0, buf0, cos_bit_col);
    round_shift_16bit_w16_avx2(buf0, height, shift[1]);
    for (int j = 0; j < AOMMIN(2, height_div16); ++j) {
      transpose_16bit_16x16_avx2(buf0 + j * 16, buf1 + j * width + 16 * i);
    }
  }

  for (int i = 0; i < AOMMIN(2, height_div16); i++) {
    __m256i bufA[32];
    __m256i bufB[32];
    __m128i *buf = (__m128i *)(buf1 + width * i);
    for (int j = 0; j < width; ++j) {
      bufA[j] = _mm256_cvtepi16_epi32(buf[j * 2]);
      bufB[j] = _mm256_cvtepi16_epi32(buf[j * 2 + 1]);
    }
    fdct32_avx2(bufA, bufA, cos_bit_row);
    fdct32_avx2(bufB, bufB, cos_bit_row);
    round_shift_rect_array_32_avx2(bufA, bufA, 32, -shift[2], NewSqrt2);
    round_shift_rect_array_32_avx2(bufB, bufB, 32, -shift[2], NewSqrt2);

    store_output_32bit_w16(output + i * 16, bufA, bufB, 32, 32);
  }
}